

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O3

FT_Error cid_slot_init(FT_GlyphSlot slot)

{
  long lVar1;
  FT_Module pFVar2;
  void *pvVar3;
  
  lVar1 = slot->face[2].bbox.yMin;
  if (lVar1 != 0) {
    pFVar2 = FT_Get_Module((slot->face->driver->root).library,"pshinter");
    if (pFVar2 != (FT_Module)0x0) {
      pvVar3 = (void *)(**(code **)(lVar1 + 8))(pFVar2);
      slot->internal->glyph_hints = pvVar3;
    }
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cid_slot_init( FT_GlyphSlot  slot )
  {
    CID_Face          face;
    PSHinter_Service  pshinter;


    face     = (CID_Face)slot->face;
    pshinter = (PSHinter_Service)face->pshinter;

    if ( pshinter )
    {
      FT_Module  module;


      module = FT_Get_Module( slot->face->driver->root.library,
                              "pshinter" );
      if ( module )
      {
        T1_Hints_Funcs  funcs;


        funcs = pshinter->get_t1_funcs( module );
        slot->internal->glyph_hints = (void*)funcs;
      }
    }

    return 0;
  }